

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O2

int mbedtls_gcm_update_ad(mbedtls_gcm_context *ctx,uchar *add,size_t add_len)

{
  uchar *x;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  
  uVar2 = ctx->add_len;
  uVar4 = add_len + uVar2;
  if (uVar4 >> 0x3d == 0 && uVar2 <= uVar4) {
    uVar3 = uVar2 & 0xf;
    if (uVar3 != 0) {
      uVar5 = 0x10 - uVar3;
      if (add_len <= 0x10 - uVar3) {
        uVar5 = add_len;
      }
      uVar4 = 0;
      while (uVar4 + 8 <= uVar5) {
        *(ulong *)(ctx->buf + uVar4 + uVar3 + 0x178 + -0x178) =
             *(ulong *)(ctx->buf + uVar4 + uVar3 + 0x178 + -0x178) ^ *(ulong *)(add + uVar4);
        uVar4 = uVar4 + 8;
      }
      for (; uVar4 < uVar5; uVar4 = uVar4 + 1) {
        ctx->buf[uVar4 + uVar3 + 0x178 + -0x178] =
             ctx->buf[uVar4 + uVar3 + 0x178 + -0x178] ^ add[uVar4];
      }
      if (uVar3 + uVar5 == 0x10) {
        gcm_mult(ctx,ctx->buf,ctx->buf);
        uVar2 = ctx->add_len;
      }
      uVar4 = uVar2 + add_len;
      add_len = add_len - uVar5;
      add = add + uVar5;
    }
    ctx->add_len = uVar4;
    x = ctx->buf;
    for (; 0xf < add_len; add_len = add_len - 0x10) {
      for (uVar2 = 0; uVar2 < 9; uVar2 = uVar2 + 8) {
        *(ulong *)(ctx->buf + uVar2) = *(ulong *)(ctx->buf + uVar2) ^ *(ulong *)(add + uVar2);
      }
      gcm_mult(ctx,x,x);
      add = add + 0x10;
    }
    if (add_len != 0) {
      uVar2 = 0;
      while (uVar2 + 8 <= add_len) {
        *(ulong *)(x + uVar2) = *(ulong *)(x + uVar2) ^ *(ulong *)(add + uVar2);
        uVar2 = uVar2 + 8;
      }
      pbVar6 = add + uVar2;
      for (; uVar2 < add_len; uVar2 = uVar2 + 1) {
        x[uVar2] = x[uVar2] ^ *pbVar6;
        pbVar6 = pbVar6 + 1;
      }
    }
    iVar1 = 0;
  }
  else {
    iVar1 = -0x14;
  }
  return iVar1;
}

Assistant:

int mbedtls_gcm_update_ad(mbedtls_gcm_context *ctx,
                          const unsigned char *add, size_t add_len)
{
    const unsigned char *p;
    size_t use_len, offset;
    uint64_t new_add_len;

    /* AD is limited to 2^64 bits, ie 2^61 bytes
     * Also check for possible overflow */
#if SIZE_MAX > 0xFFFFFFFFFFFFFFFFULL
    if (add_len > 0xFFFFFFFFFFFFFFFFULL) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }
#endif
    new_add_len = ctx->add_len + (uint64_t) add_len;
    if (new_add_len < ctx->add_len || new_add_len >> 61 != 0) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    offset = ctx->add_len % 16;
    p = add;

    if (offset != 0) {
        use_len = 16 - offset;
        if (use_len > add_len) {
            use_len = add_len;
        }

        mbedtls_xor(ctx->buf + offset, ctx->buf + offset, p, use_len);

        if (offset + use_len == 16) {
            gcm_mult(ctx, ctx->buf, ctx->buf);
        }

        ctx->add_len += use_len;
        add_len -= use_len;
        p += use_len;
    }

    ctx->add_len += add_len;

    while (add_len >= 16) {
        mbedtls_xor(ctx->buf, ctx->buf, p, 16);

        gcm_mult(ctx, ctx->buf, ctx->buf);

        add_len -= 16;
        p += 16;
    }

    if (add_len > 0) {
        mbedtls_xor(ctx->buf, ctx->buf, p, add_len);
    }

    return 0;
}